

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

void slang::ast::SemanticFacts::populateTimeScale
               (TimeScale *timeScale,Scope *scope,optional<slang::TimeScale> directiveTimeScale,
               bool hasBase,bool hasPrecision)

{
  bool bVar1;
  Symbol *pSVar2;
  TimeScale *pTVar3;
  TimeScale local_2b;
  _Storage<slang::TimeScale,_true> local_27;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  optional<slang::TimeScale> ts;
  bool hasPrecision_local;
  Scope *pSStack_20;
  bool hasBase_local;
  Scope *scope_local;
  TimeScale *timeScale_local;
  optional<slang::TimeScale> directiveTimeScale_local;
  
  if ((!hasBase) || (!hasPrecision)) {
    local_22 = hasPrecision;
    local_21 = hasBase;
    pSStack_20 = scope;
    std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)&local_27._M_value);
    pSVar2 = Scope::asSymbol(pSStack_20);
    if (pSVar2->kind == CompilationUnit) {
      local_27 = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_payload;
      local_23 = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_engaged;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_27._M_value);
    if (!bVar1) {
      local_2b = Scope::getTimeScale(pSStack_20);
      std::optional<slang::TimeScale>::operator=
                ((optional<slang::TimeScale> *)&local_27._M_value,&local_2b);
    }
    if ((local_21 & 1) == 0) {
      pTVar3 = std::optional<slang::TimeScale>::operator->
                         ((optional<slang::TimeScale> *)&local_27._M_value);
      timeScale->base = pTVar3->base;
    }
    if ((local_22 & 1) == 0) {
      pTVar3 = std::optional<slang::TimeScale>::operator->
                         ((optional<slang::TimeScale> *)&local_27._M_value);
      timeScale->precision = pTVar3->precision;
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(TimeScale& timeScale, const Scope& scope,
                                      std::optional<TimeScale> directiveTimeScale, bool hasBase,
                                      bool hasPrecision) {
    // If no time unit was set, infer one based on the following rules:
    // - If the scope is nested (inside another definition), inherit from that definition.
    // - Otherwise use a `timescale directive if there is one.
    // - Otherwise, look for a time unit in the compilation scope.
    // - Finally use the compilation default.
    if (hasBase && hasPrecision)
        return;

    std::optional<TimeScale> ts;
    if (scope.asSymbol().kind == SymbolKind::CompilationUnit)
        ts = directiveTimeScale;

    if (!ts)
        ts = scope.getTimeScale();

    if (!hasBase)
        timeScale.base = ts->base;
    if (!hasPrecision)
        timeScale.precision = ts->precision;

    // TODO: error if inferred timescale is invalid (because precision > units)
}